

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void StoreTrivialContextMap
               (size_t num_types,size_t context_bits,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  ulong uVar1;
  byte bVar2;
  ulong length;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint8_t depths [272];
  uint16_t bits [272];
  uint32_t histogram [272];
  undefined8 local_7b0;
  byte local_7a8 [272];
  uint16_t local_698;
  ushort auStack_696 [269];
  undefined4 auStack_47c [275];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    uVar1 = context_bits - 1;
    length = (context_bits + num_types) - 1;
    local_7b0 = tree;
    memset(auStack_47c + 1,0,length * 4);
    uVar3 = *storage_ix;
    *(ulong *)(storage + (uVar3 >> 3)) = (ulong)storage[uVar3 >> 3] | 1L << ((byte)uVar3 & 7);
    uVar6 = uVar3 + 1;
    *storage_ix = uVar6;
    if (0xf < context_bits - 2) {
LAB_00116f49:
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    uVar7 = ~(-1 << ((byte)uVar1 & 0x1f));
    *(size_t *)(storage + (uVar6 >> 3)) =
         context_bits - 2 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar3 + 5;
    auStack_47c[context_bits] = (int)num_types;
    auStack_47c[1] = 1;
    if (context_bits < length) {
      sVar4 = 0;
      do {
        auStack_47c[context_bits + sVar4 + 1] = 1;
        sVar4 = sVar4 + 1;
      } while (num_types - 1 != sVar4);
    }
    BuildAndStoreHuffmanTree
              (auStack_47c + 1,length,local_7b0,local_7a8,&local_698,storage_ix,storage);
    lVar8 = 0;
    do {
      lVar5 = lVar8 + uVar1;
      if (lVar8 == 0) {
        lVar5 = 0;
      }
      bVar2 = local_7a8[lVar5];
      if (auStack_696[lVar5 + -1] >> (bVar2 & 0x3f) != 0) goto LAB_00116f49;
      if (0x38 < bVar2) {
LAB_00116f68:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      uVar6 = *storage_ix;
      uVar3 = bVar2 + uVar6;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)auStack_696[lVar5 + -1] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar3;
      bVar2 = local_7a8[context_bits - 1];
      if (auStack_696[context_bits - 2] >> (bVar2 & 0x3f) != 0) goto LAB_00116f49;
      if (0x38 < bVar2) goto LAB_00116f68;
      uVar6 = bVar2 + uVar3;
      *(ulong *)(storage + (uVar3 >> 3)) =
           (ulong)auStack_696[context_bits - 2] << ((byte)uVar3 & 7) | (ulong)storage[uVar3 >> 3];
      *storage_ix = uVar6;
      if (uVar7 >> ((byte)uVar1 & 0x3f) != 0) goto LAB_00116f49;
      if (0x38 < uVar1) goto LAB_00116f68;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)uVar7 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar6 + uVar1;
      lVar8 = lVar8 + 1;
    } while (num_types + (num_types == 0) != lVar8);
    uVar1 = *storage_ix;
    *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3] | 1L << ((byte)uVar1 & 7);
    *storage_ix = uVar1 + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, tree,
                             depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}